

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::LocalVariableDeclarationSyntax::LocalVariableDeclarationSyntax
          (LocalVariableDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token var,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  Token TVar1;
  bool bVar2;
  DataTypeSyntax *pDVar3;
  DeclaratorSyntax *pDVar4;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_38;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators_local;
  DataTypeSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  LocalVariableDeclarationSyntax *this_local;
  Token var_local;
  
  TVar1 = semi;
  var_local._0_8_ = var.info;
  this_local = var._0_8_;
  local_38 = declarators;
  declarators_local = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)type;
  type_local = (DataTypeSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,LocalVariableDeclaration,attributes);
  *(LocalVariableDeclarationSyntax **)&this->var = this_local;
  (this->var).info = (Info *)var_local._0_8_;
  __range2 = declarators_local;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&__range2);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (&this->declarators,local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  pDVar3 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin(&this->declarators);
  _child = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(&this->declarators);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::DeclaratorSyntax_*> *)&child
                        );
    if (!bVar2) break;
    pDVar4 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::operator*
                       ((iterator_base<slang::syntax::DeclaratorSyntax_*> *)&__end2.index);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

LocalVariableDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token var, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::LocalVariableDeclaration, attributes), var(var), type(&type), declarators(declarators), semi(semi) {
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }